

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall cmComputeLinkDepends::InferDependencies(cmComputeLinkDepends *this)

{
  bool bVar1;
  DependSetList *pDVar2;
  reference pvVar3;
  iterator __first1;
  iterator __last1;
  iterator __first2;
  iterator __last2;
  iterator __i;
  vector<cmGraphEdge,std::allocator<cmGraphEdge>> *this_00;
  size_type sVar4;
  size_type sVar5;
  reference __args;
  cmRange<__gnu_cxx::__normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>_>
  cVar6;
  insert_iterator<cmComputeLinkDepends::DependSet> __result;
  cmListFileBacktrace local_158;
  bool local_142;
  bool local_141;
  reference local_140;
  unsigned_long *c;
  iterator __end2_1;
  iterator __begin2_1;
  DependSet *__range2_1;
  cmGraphEdgeList *edges;
  undefined1 local_d0 [8];
  DependSet intersection;
  DependSet *i;
  __normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>
  __end2;
  __normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>
  __begin2;
  cmRange<__gnu_cxx::__normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>_>
  local_78;
  cmRange<__gnu_cxx::__normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>_>
  local_68;
  cmRange<__gnu_cxx::__normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>_>
  *local_58;
  cmRange<__gnu_cxx::__normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>_>
  *__range2;
  DependSet common;
  DependSetList *sets;
  size_t depender_index;
  cmComputeLinkDepends *this_local;
  
  sets = (DependSetList *)0x0;
  while( true ) {
    pDVar2 = (DependSetList *)
             std::
             vector<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
             ::size(&this->InferredDependSets);
    if (pDVar2 <= sets) break;
    common.super_set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>._M_t.
    _M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::
                 vector<cmComputeLinkDepends::DependSetList,_std::allocator<cmComputeLinkDepends::DependSetList>_>
                 ::operator[](&this->InferredDependSets,(size_type)sets);
    if ((((reference)
         common.super_set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>.
         _M_t._M_impl.super__Rb_tree_header._M_node_count)->Initialized & 1U) != 0) {
      bVar1 = std::
              vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
              ::empty((vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                       *)common.
                         super_set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                         ._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (!bVar1) {
        pvVar3 = std::
                 vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                 ::front((vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                          *)common.
                            super_set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                            ._M_t._M_impl.super__Rb_tree_header._M_node_count);
        DependSet::DependSet((DependSet *)&__range2,pvVar3);
        cVar6 = cmMakeRange<cmComputeLinkDepends::DependSetList>
                          ((DependSetList *)
                           common.
                           super_set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           ._M_t._M_impl.super__Rb_tree_header._M_node_count);
        local_78 = cVar6;
        cVar6 = cmRange<__gnu_cxx::__normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>_>
                ::advance(&local_78,1);
        local_58 = &local_68;
        local_68 = cVar6;
        __end2 = cmRange<__gnu_cxx::__normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>_>
                 ::begin(local_58);
        i = (DependSet *)
            cmRange<__gnu_cxx::__normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>_>
            ::end(local_58);
        while( true ) {
          bVar1 = __gnu_cxx::operator!=
                            (&__end2,(__normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>
                                      *)&i);
          if (!bVar1) break;
          intersection.
          super_set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>._M_t.
          _M_impl.super__Rb_tree_header._M_node_count =
               (size_t)__gnu_cxx::
                       __normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>
                       ::operator*(&__end2);
          DependSet::DependSet((DependSet *)local_d0);
          __first1 = std::
                     set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                     begin((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)&__range2);
          __last1 = std::
                    set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                    end((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)&__range2);
          __first2 = std::
                     set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                     begin((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)intersection.
                              super_set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                              ._M_t._M_impl.super__Rb_tree_header._M_node_count);
          __last2 = std::
                    set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                    end((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                         *)intersection.
                           super_set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           ._M_t._M_impl.super__Rb_tree_header._M_node_count);
          __i = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                begin((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                       *)local_d0);
          __result = std::inserter<cmComputeLinkDepends::DependSet>((DependSet *)local_d0,__i);
          std::
          set_intersection<std::_Rb_tree_const_iterator<unsigned_long>,std::_Rb_tree_const_iterator<unsigned_long>,std::insert_iterator<cmComputeLinkDepends::DependSet>>
                    ((_Rb_tree_const_iterator<unsigned_long>)__first1._M_node,
                     (_Rb_tree_const_iterator<unsigned_long>)__last1._M_node,
                     (_Rb_tree_const_iterator<unsigned_long>)__first2._M_node,
                     (_Rb_tree_const_iterator<unsigned_long>)__last2._M_node,__result);
          DependSet::operator=((DependSet *)&__range2,(DependSet *)local_d0);
          DependSet::~DependSet((DependSet *)local_d0);
          __gnu_cxx::
          __normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>
          ::operator++(&__end2);
        }
        this_00 = (vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                            (&(this->EntryConstraintGraph).
                              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                             (size_type)sets);
        sVar4 = std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::size
                          ((vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)this_00);
        sVar5 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                size((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *
                     )&__range2);
        std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::reserve
                  ((vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)this_00,sVar4 + sVar5);
        __end2_1 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                   ::begin((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                            *)&__range2);
        c = (unsigned_long *)
            std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::end
                      ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                        *)&__range2);
        while( true ) {
          bVar1 = std::operator!=(&__end2_1,(_Self *)&c);
          if (!bVar1) break;
          __args = std::_Rb_tree_const_iterator<unsigned_long>::operator*(&__end2_1);
          local_141 = true;
          local_142 = false;
          local_158.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)0x0;
          local_158.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
          super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_140 = __args;
          cmListFileBacktrace::cmListFileBacktrace(&local_158);
          std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
          emplace_back<unsigned_long_const&,bool,bool,cmListFileBacktrace>
                    (this_00,__args,&local_141,&local_142,&local_158);
          cmListFileBacktrace::~cmListFileBacktrace(&local_158);
          std::_Rb_tree_const_iterator<unsigned_long>::operator++(&__end2_1);
        }
        DependSet::~DependSet((DependSet *)&__range2);
      }
    }
    sets = (DependSetList *)
           ((long)&(sets->
                   super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                   ).
                   super__Vector_base<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                   ._M_impl.super__Vector_impl_data._M_start + 1);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::InferDependencies()
{
  // The inferred dependency sets for each item list the possible
  // dependencies.  The intersection of the sets for one item form its
  // inferred dependencies.
  for (size_t depender_index = 0;
       depender_index < this->InferredDependSets.size(); ++depender_index) {
    // Skip items for which dependencies do not need to be inferred or
    // for which the inferred dependency sets are empty.
    DependSetList& sets = this->InferredDependSets[depender_index];
    if (!sets.Initialized || sets.empty()) {
      continue;
    }

    // Intersect the sets for this item.
    DependSet common = sets.front();
    for (DependSet const& i : cmMakeRange(sets).advance(1)) {
      DependSet intersection;
      std::set_intersection(common.begin(), common.end(), i.begin(), i.end(),
                            std::inserter(intersection, intersection.begin()));
      common = intersection;
    }

    // Add the inferred dependencies to the graph.
    cmGraphEdgeList& edges = this->EntryConstraintGraph[depender_index];
    edges.reserve(edges.size() + common.size());
    for (auto const& c : common) {
      edges.emplace_back(c, true, false, cmListFileBacktrace());
    }
  }
}